

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

ScalarFunction *
duckdb::CMIntegralDecompressFun::GetFunction
          (ScalarFunction *__return_storage_ptr__,LogicalType *input_type,LogicalType *result_type)

{
  uint uVar1;
  uint uVar2;
  LogicalType varargs;
  long lVar3;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff14;
  FunctionNullHandling in_stack_ffffffffffffff20;
  bind_lambda_function_t in_stack_ffffffffffffff28;
  _Any_data local_d0;
  code *local_c0;
  LogicalType local_b0;
  vector<duckdb::LogicalType,_true> local_98;
  LogicalType local_80;
  LogicalType local_68 [2];
  string local_38;
  
  IntegralDecompressFunctionName_abi_cxx11_(&local_38,(duckdb *)result_type,result_type);
  LogicalType::LogicalType(local_68,input_type);
  LogicalType::LogicalType(local_68 + 1,result_type);
  __l._M_len = 2;
  __l._M_array = local_68;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_98,__l,
             (allocator_type *)&stack0xffffffffffffff2f);
  LogicalType::LogicalType(&local_b0,result_type);
  uVar1._0_1_ = result_type->id_;
  uVar1._1_1_ = result_type->physical_type_;
  uVar1._2_2_ = *(undefined2 *)&result_type->field_0x2;
  uVar2._0_1_ = input_type->id_;
  uVar2._1_1_ = input_type->physical_type_;
  uVar2._2_2_ = *(undefined2 *)&input_type->field_0x2;
  GetIntegralDecompressFunctionInputSwitch
            ((scalar_function_t *)&local_d0,(LogicalType *)(ulong)uVar2,(LogicalType *)(ulong)uVar1)
  ;
  LogicalType::LogicalType(&local_80,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_80;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff0c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff14;
  ScalarFunction::ScalarFunction
            (__return_storage_ptr__,&local_38,&local_98,&local_b0,(scalar_function_t *)&local_d0,
             CMUtils::Bind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff28);
  LogicalType::~LogicalType(&local_80);
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_b0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_98);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_68[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  __return_storage_ptr__->serialize = CMIntegralSerialize;
  __return_storage_ptr__->deserialize =
       CMIntegralDeserialize<&duckdb::GetIntegralDecompressFunctionInputSwitch>;
  return __return_storage_ptr__;
}

Assistant:

ScalarFunction CMIntegralDecompressFun::GetFunction(const LogicalType &input_type, const LogicalType &result_type) {
	ScalarFunction result(IntegralDecompressFunctionName(result_type), {input_type, result_type}, result_type,
	                      GetIntegralDecompressFunctionInputSwitch(input_type, result_type), CMUtils::Bind);
	result.serialize = CMIntegralSerialize;
	result.deserialize = CMIntegralDeserialize<GetIntegralDecompressFunctionInputSwitch>;
	return result;
}